

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O1

int comex_accs(int datatype,void *scale,void *src_ptr,int *src_stride_ar,void *dst_ptr,
              int *dst_stride_ar,int *count,int stride_levels,int proc,comex_group_t group)

{
  int iVar1;
  int iVar2;
  int *message;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  char *__assertion;
  uint uVar9;
  void *dst;
  size_t sVar10;
  long lVar11;
  void *__src;
  int src_bvalue [7];
  int dst_bvalue [7];
  int src_bunit [7];
  int dst_bunit [7];
  int local_f8 [2];
  undefined1 local_f0 [32];
  long local_d0;
  int *local_c8;
  size_t local_c0;
  size_t local_b8;
  void *local_b0;
  void *local_a8;
  ulong local_a0;
  undefined8 local_98;
  undefined1 local_90 [24];
  int local_78 [8];
  undefined8 local_58;
  int aiStack_50 [8];
  
  local_b0 = src_ptr;
  local_a8 = dst_ptr;
  iVar2 = comex_group_size(group,local_f8);
  if (iVar2 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < local_f8[0]) {
        if (group != 0) {
          comex_group_translate_world(group,proc,local_78);
          proc = local_78[0];
        }
        if (stride_levels < 1) {
          uVar8 = 1;
        }
        else {
          uVar8 = 1;
          uVar3 = 1;
          do {
            uVar8 = uVar8 * count[uVar3];
            uVar3 = uVar3 + 1;
          } while (stride_levels + 1 != uVar3);
        }
        local_f8[0] = 0;
        local_f8[1] = 0;
        local_78[0] = 1;
        local_78[1] = 1;
        local_98 = 0;
        local_58 = 0x100000001;
        if (1 < stride_levels) {
          sVar10 = (ulong)(stride_levels - 1) << 2;
          lVar5 = 0;
          memset(local_f0,0,sVar10);
          memset(local_90,0,sVar10);
          iVar2 = local_58._4_4_;
          iVar4 = local_78[1];
          do {
            iVar1 = count[lVar5 + 1];
            iVar4 = iVar4 * iVar1;
            local_78[lVar5 + 2] = iVar4;
            iVar2 = iVar2 * iVar1;
            aiStack_50[lVar5] = iVar2;
            lVar5 = lVar5 + 1;
          } while ((ulong)(uint)stride_levels - 1 != lVar5);
        }
        if (0 < (int)uVar8) {
          local_d0 = (long)proc;
          lVar5 = (ulong)(stride_levels + 1) - 1;
          uVar3 = 0;
          local_c8 = dst_stride_ar;
          do {
            if (stride_levels < 1) {
              lVar11 = 0;
            }
            else {
              lVar6 = 0;
              lVar11 = 0;
              do {
                iVar2 = *(int *)(local_f0 + lVar6 * 4 + -4);
                if (((int)uVar3 + 1) % local_78[lVar6 + 1] == 0) {
                  *(int *)(local_f0 + lVar6 * 4 + -4) = iVar2 + 1;
                }
                lVar11 = lVar11 + (long)src_stride_ar[lVar6] * (long)iVar2;
                iVar2 = *(int *)(local_f0 + lVar6 * 4 + -4);
                if (count[lVar6 + 1] <= iVar2) {
                  iVar2 = 0;
                }
                *(int *)(local_f0 + lVar6 * 4 + -4) = iVar2;
                lVar6 = lVar6 + 1;
              } while (lVar5 != lVar6);
            }
            if (stride_levels < 1) {
              lVar6 = 0;
            }
            else {
              lVar7 = 0;
              lVar6 = 0;
              do {
                iVar2 = *(int *)(local_90 + lVar7 * 4 + -4);
                if (((int)uVar3 + 1) % aiStack_50[lVar7 + -1] == 0) {
                  *(int *)(local_90 + lVar7 * 4 + -4) = iVar2 + 1;
                }
                lVar6 = lVar6 + (long)dst_stride_ar[lVar7] * (long)iVar2;
                iVar2 = *(int *)(local_90 + lVar7 * 4 + -4);
                if (count[lVar7 + 1] <= iVar2) {
                  iVar2 = 0;
                }
                *(int *)(local_90 + lVar7 * 4 + -4) = iVar2;
                lVar7 = lVar7 + 1;
              } while (lVar5 != lVar7);
            }
            if (5 < datatype - 0x25U) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                            ,0x2c2,"int _acc_nbi(void *, void *, int, int, int, void *)");
            }
            __src = (void *)(lVar11 + (long)local_b0);
            dst = (void *)(lVar6 + (long)local_a8);
            iVar2 = *count;
            local_a0 = uVar3;
            if (l_state.rank == proc) {
              _acc(datatype,iVar2,dst,__src,scale);
            }
            else {
              local_c0 = *(size_t *)(&DAT_001b8548 + (ulong)(datatype - 0x25U) * 8);
              local_b8 = (size_t)((int)local_c0 + iVar2 + 0x28);
              message = (int *)_my_malloc(local_b8);
              sVar10 = local_c0;
              *message = datatype + -0x22;
              *(void **)(message + 2) = dst;
              *(void **)(message + 4) = __src;
              message[6] = iVar2;
              message[8] = 0;
              message[9] = 0;
              memcpy(message + 10,scale,local_c0);
              memcpy((void *)((long)message + sVar10 + 0x28),__src,(long)iVar2);
              dst_stride_ar = local_c8;
              fence_array[local_d0] = '\x01';
              _mq_push(proc,(char *)message,(int)local_b8);
              if (7 < l_state.mq_size) {
                comex_make_progress();
              }
            }
            uVar9 = (int)local_a0 + 1;
            uVar3 = (ulong)uVar9;
          } while (uVar9 != uVar8);
        }
        comex_make_progress();
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x3b1,
                "int comex_accs(int, void *, void *, int *, void *, int *, int *, int, int, comex_group_t)"
               );
}

Assistant:

int comex_accs(
        int datatype, void *scale,
        void *src_ptr, int *src_stride_ar,
        void *dst_ptr, int *dst_stride_ar,
        int *count, int stride_levels,
        int proc, comex_group_t group)
{
    int i, j;
    long src_idx, dst_idx;  /* index offset of current block position to ptr */
    int n1dim;  /* number of 1 dim block */
    int src_bvalue[7], src_bunit[7];
    int dst_bvalue[7], dst_bunit[7];

    CHECK_GROUP(group,proc);
#if DEBUG
    if (stride_levels) {
        printf("[%d] comex_accs(src_ptr=%p, src_stride_ar[0]=%d, dst_ptr=%p, dst_stride_ar[0]=%d, count[0]=%d, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, src_stride_ar[0], dst_ptr, dst_stride_ar[0], count[0], stride_levels, proc);
    }
    else {
        printf("[%d] comex_accs(src_ptr=%p, src_stride_ar=NULL, dst_ptr=%p, dst_stride_ar=NULL, count=NULL, stride_levels=%d, proc=%d)\n",
                l_state.rank, src_ptr, dst_ptr, stride_levels, proc);
    }
#endif

    /* number of n-element of the first dimension */
    n1dim = 1;
    for(i=1; i<=stride_levels; i++) {
        n1dim *= count[i];
    }

    /* calculate the destination indices */
    src_bvalue[0] = 0; src_bvalue[1] = 0; src_bunit[0] = 1; src_bunit[1] = 1;
    dst_bvalue[0] = 0; dst_bvalue[1] = 0; dst_bunit[0] = 1; dst_bunit[1] = 1;

    for(i=2; i<=stride_levels; i++) {
        src_bvalue[i] = 0;
        dst_bvalue[i] = 0;
        src_bunit[i] = src_bunit[i-1] * count[i-1];
        dst_bunit[i] = dst_bunit[i-1] * count[i-1];
    }

    /* index mangling */
    for(i=0; i<n1dim; i++) {
        src_idx = 0;
        dst_idx = 0;
        for(j=1; j<=stride_levels; j++) {
	  src_idx += (long) src_bvalue[j] * (long) src_stride_ar[j-1];
            if((i+1) % src_bunit[j] == 0) {
                src_bvalue[j]++;
            }
            if(src_bvalue[j] > (count[j]-1)) {
                src_bvalue[j] = 0;
            }
        }

        for(j=1; j<=stride_levels; j++) {
	  dst_idx += (long) dst_bvalue[j] * (long) dst_stride_ar[j-1];
            if((i+1) % dst_bunit[j] == 0) {
                dst_bvalue[j]++;
            }
            if(dst_bvalue[j] > (count[j]-1)) {
                dst_bvalue[j] = 0;
            }
        }
        
        _acc_nbi((char *)src_ptr + src_idx, 
                (char *)dst_ptr + dst_idx, count[0], proc,
                datatype, scale);
    }

    comex_wait_proc(proc, group);

    return COMEX_SUCCESS;
}